

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::EndColumns(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiOldColumns *pIVar3;
  ImGuiOldColumnData *pIVar4;
  undefined8 uVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImU32 col;
  int n_1;
  long lVar9;
  ImGuiCol idx;
  ImGuiID id;
  int n;
  ulong uVar10;
  int column_index;
  long lVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  bool held;
  bool hovered;
  float local_a0;
  uint local_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  ulong local_80;
  float local_74;
  ImGuiContext *local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImRect column_hit_rect;
  
  pIVar2 = GImGui->CurrentWindow;
  local_70 = GImGui;
  pIVar2->WriteAccessed = true;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar3->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar3->Splitter,pIVar2->DrawList);
  }
  fVar12 = (pIVar2->DC).CursorPos.y;
  local_9c = pIVar3->Flags;
  uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar12),ZEXT416((uint)pIVar3->LineMaxY),2);
  bVar8 = (bool)((byte)uVar5 & 1);
  fVar12 = (float)((uint)bVar8 * (int)pIVar3->LineMaxY + (uint)!bVar8 * (int)fVar12);
  pIVar3->LineMaxY = fVar12;
  (pIVar2->DC).CursorPos.y = fVar12;
  if ((local_9c & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->HostCursorMaxPosX;
  }
  if (((local_9c & 1) == 0) && (pIVar2->SkipItems == false)) {
    fVar13 = (pIVar2->ClipRect).Min.y;
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)pIVar3->HostCursorPosY),2);
    bVar8 = (bool)((byte)uVar5 & 1);
    fVar13 = (float)((uint)bVar8 * (int)pIVar3->HostCursorPosY + (uint)!bVar8 * (int)fVar13);
    local_74 = fVar13 + 1.0;
    auVar14 = vminss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)(pIVar2->ClipRect).Max.y));
    local_a0 = auVar14._0_4_;
    local_80 = 0xffffffffffffffff;
    lVar11 = 0x24;
    for (uVar10 = 1; iVar1 = pIVar3->Count, (long)uVar10 < (long)iVar1; uVar10 = uVar10 + 1) {
      pIVar4 = (pIVar3->Columns).Data;
      local_98._0_4_ = (pIVar2->Pos).x;
      fVar12 = GetColumnOffset((int)uVar10);
      fVar12 = fVar12 + (float)local_98._0_4_;
      column_hit_rect.Min.x = fVar12 + -4.0;
      id = pIVar3->ID + (int)uVar10;
      _local_98 = ZEXT416((uint)fVar12);
      column_hit_rect.Max.x = fVar12 + 4.0;
      column_hit_rect.Max.y = local_a0;
      column_hit_rect.Min.y = fVar13;
      KeepAliveID(id);
      bVar8 = IsClippedEx(&column_hit_rect,id);
      if (!bVar8) {
        hovered = false;
        held = false;
        if ((local_9c & 2) == 0) {
          ButtonBehavior(&column_hit_rect,id,&hovered,&held,0);
          if (hovered == false) {
            if ((held & 1U) != 0) {
              local_70->MouseCursor = 4;
              goto LAB_0027eeba;
            }
          }
          else {
            local_70->MouseCursor = 4;
            if ((held & 1U) != 0) {
LAB_0027eeba:
              if ((*(byte *)((long)&pIVar4->OffsetNorm + lVar11) & 2) == 0) {
                local_80 = uVar10;
              }
              local_80 = local_80 & 0xffffffff;
            }
          }
        }
        idx = hovered + 0x1b;
        if ((held & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        auVar14._0_4_ = (int)(float)local_98._0_4_;
        auVar14._4_4_ = (int)(float)local_98._4_4_;
        auVar14._8_4_ = (int)fStack_90;
        auVar14._12_4_ = (int)fStack_8c;
        auVar14 = vcvtdq2ps_avx(auVar14);
        local_68.x = auVar14._0_4_;
        local_60.y = local_74;
        local_68.y = local_a0;
        local_60.x = local_68.x;
        ImDrawList::AddLine(pIVar2->DrawList,&local_60,&local_68,col,1.0);
      }
      lVar11 = lVar11 + 0x1c;
    }
    column_index = (int)local_80;
    if (column_index != -1) {
      if (pIVar3->IsBeingResized == false) {
        lVar11 = 4;
        for (lVar9 = 0; lVar9 <= iVar1; lVar9 = lVar9 + 1) {
          pIVar4 = (pIVar3->Columns).Data;
          *(undefined4 *)((long)&pIVar4->OffsetNorm + lVar11) =
               *(undefined4 *)((long)pIVar4 + lVar11 + -4);
          lVar11 = lVar11 + 0x1c;
        }
      }
      pIVar3->IsBeingResized = true;
      pIVar7 = GImGui;
      _local_98 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                                - (GImGui->CurrentWindow->Pos).x));
      fVar13 = GetColumnOffset(column_index + -1);
      fVar12 = (pIVar7->Style).ColumnsMinSpacing;
      fVar13 = fVar13 + fVar12;
      uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar13),_local_98,2);
      bVar8 = (bool)((byte)uVar5 & 1);
      fVar13 = (float)((uint)bVar8 * local_98._0_4_ + (uint)!bVar8 * (int)fVar13);
      if ((pIVar3->Flags & 4) != 0) {
        _local_98 = ZEXT416((uint)fVar13);
        local_a0 = fVar12;
        fVar12 = GetColumnOffset(column_index + 1);
        _local_98 = vminss_avx(_local_98,ZEXT416((uint)(fVar12 - local_a0)));
        fVar13 = (float)local_98._0_4_;
      }
      SetColumnOffset(column_index,fVar13);
    }
    bVar8 = column_index != -1;
  }
  else {
    bVar8 = false;
  }
  pIVar3->IsBeingResized = bVar8;
  IVar6 = (pIVar2->ParentWorkRect).Max;
  (pIVar2->WorkRect).Min = (pIVar2->ParentWorkRect).Min;
  (pIVar2->WorkRect).Max = IVar6;
  IVar6 = (pIVar3->HostBackupParentWorkRect).Max;
  (pIVar2->ParentWorkRect).Min = (pIVar3->HostBackupParentWorkRect).Min;
  (pIVar2->ParentWorkRect).Max = IVar6;
  (pIVar2->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  auVar14 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0)));
  (pIVar2->DC).CursorPos.x = auVar14._0_4_;
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id)) // FIXME: Can be removed or replaced with a lower-level test
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}